

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

void duckdb::RoundDecimalOperator::Operation<long,duckdb::NumericHelper>
               (DataChunk *input,uint8_t scale,Vector *result)

{
  reference input_00;
  undefined7 in_register_00000031;
  long addition;
  long power_of_ten;
  long local_40;
  long local_38;
  long *local_30;
  long *local_28;
  
  local_38 = *(long *)(NumericHelper::POWERS_OF_TEN +
                      (CONCAT71(in_register_00000031,scale) & 0xffffffff) * 8);
  local_40 = local_38 / 2;
  input_00 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  local_30 = &local_40;
  local_28 = &local_38;
  UnaryExecutor::
  ExecuteStandard<long,long,duckdb::UnaryLambdaWrapper,duckdb::RoundDecimalOperator::Operation<long,duckdb::NumericHelper>(duckdb::DataChunk&,unsigned_char,duckdb::Vector&)::_lambda(long)_1_>
            (input_00,result,input->count,&local_30,false,CAN_THROW_RUNTIME_ERROR);
  return;
}

Assistant:

static void Operation(DataChunk &input, uint8_t scale, Vector &result) {
		T power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[scale]);
		T addition = power_of_ten / 2;
		// regular round rounds towards the nearest number
		// in case of a tie we round away from zero
		// i.e. -10.5 -> -11, 10.5 -> 11
		// we implement this by adding (positive) or subtracting (negative) 0.5
		// and then flooring the number
		// e.g. 10.5 + 0.5 = 11, floor(11) = 11
		//      10.4 + 0.5 = 10.9, floor(10.9) = 10
		UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
			if (input < 0) {
				input -= addition;
			} else {
				input += addition;
			}
			return UnsafeNumericCast<T>(input / power_of_ten);
		});
	}